

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::emit_uninitialized_temporary
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id)

{
  anon_class_8_2_3ce7c506_for__M_pred __pred;
  bool bVar1;
  uint32_t id;
  size_type sVar2;
  SPIRBlock *pSVar3;
  pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
  *ppVar4;
  pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
  *ppVar5;
  SPIRType *type_00;
  Bitset *flags_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  value_type *__x;
  string local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0 [32];
  string local_a0;
  undefined1 local_70 [8];
  string initializer;
  Bitset *flags;
  SPIRType *type;
  SPIRBlock *header;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  header._0_4_ = result_id;
  header._4_4_ = result_type;
  _result_id_local = this;
  if ((((this->block_temporary_hoisting & 1U) == 0) &&
      (this->current_continue_block != (SPIRBlock *)0x0)) &&
     (sVar2 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&(this->super_Compiler).hoisted_temporaries,(key_type *)&header), sVar2 == 0))
  {
    id = TypedID::operator_cast_to_unsigned_int
                   ((TypedID *)&this->current_continue_block->loop_dominator);
    pSVar3 = Compiler::get<diligent_spirv_cross::SPIRBlock>(&this->super_Compiler,id);
    ppVar4 = ::std::
             begin<diligent_spirv_cross::SmallVector<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,8ul>>
                       (&pSVar3->declare_temporary);
    ppVar5 = ::std::
             end<diligent_spirv_cross::SmallVector<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,8ul>>
                       (&pSVar3->declare_temporary);
    __pred.result_id = (uint32_t)header;
    __pred.result_type = header._4_4_;
    ppVar4 = ::std::
             find_if<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>*,diligent_spirv_cross::CompilerGLSL::emit_uninitialized_temporary(unsigned_int,unsigned_int)::__0>
                       (ppVar4,ppVar5,__pred);
    ppVar5 = ::std::
             end<diligent_spirv_cross::SmallVector<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,8ul>>
                       (&pSVar3->declare_temporary);
    if (ppVar4 == ppVar5) {
      SmallVector<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,8ul>
      ::emplace_back<unsigned_int&,unsigned_int&>
                ((SmallVector<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,8ul>
                  *)&pSVar3->declare_temporary,(uint *)((long)&header + 4),(uint *)&header);
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
               &(this->super_Compiler).hoisted_temporaries,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&header,__x);
      Compiler::force_recompile(&this->super_Compiler);
    }
  }
  else {
    sVar2 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&(this->super_Compiler).hoisted_temporaries,(key_type *)&header);
    if (sVar2 == 0) {
      type_00 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,header._4_4_);
      TypedID<(diligent_spirv_cross::Types)0>::TypedID
                ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&initializer.field_2 + 0xc),
                 (uint32_t)header);
      flags_00 = Compiler::get_decoration_bitset
                           (&this->super_Compiler,(ID)initializer.field_2._12_4_);
      add_local_variable_name(this,(uint32_t)header);
      ::std::__cxx11::string::string((string *)local_70);
      if ((((this->options).force_zero_initialized_variables & 1U) != 0) &&
         (bVar1 = type_can_zero_initialize(this,type_00), bVar1)) {
        (*(this->super_Compiler)._vptr_Compiler[0x3b])(local_c0,this,(ulong)header._4_4_);
        join<char_const(&)[4],std::__cxx11::string>
                  (&local_a0,(diligent_spirv_cross *)0xf415bc,(char (*) [4])local_c0,in_RCX);
        ::std::__cxx11::string::operator=((string *)local_70,(string *)&local_a0);
        ::std::__cxx11::string::~string((string *)&local_a0);
        ::std::__cxx11::string::~string(local_c0);
      }
      flags_to_qualifiers_glsl_abi_cxx11_(&local_e0,this,type_00,flags_00);
      (*(this->super_Compiler)._vptr_Compiler[6])(local_120,this,(ulong)(uint32_t)header,1);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_100,this,type_00,local_120,0);
      statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                (this,&local_e0,&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 (char (*) [2])0xf651e6);
      ::std::__cxx11::string::~string((string *)&local_100);
      ::std::__cxx11::string::~string(local_120);
      ::std::__cxx11::string::~string((string *)&local_e0);
      ::std::__cxx11::string::~string((string *)local_70);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_uninitialized_temporary(uint32_t result_type, uint32_t result_id)
{
	// If we're declaring temporaries inside continue blocks,
	// we must declare the temporary in the loop header so that the continue block can avoid declaring new variables.
	if (!block_temporary_hoisting && current_continue_block && !hoisted_temporaries.count(result_id))
	{
		auto &header = get<SPIRBlock>(current_continue_block->loop_dominator);
		if (find_if(begin(header.declare_temporary), end(header.declare_temporary),
		            [result_type, result_id](const pair<uint32_t, uint32_t> &tmp) {
			            return tmp.first == result_type && tmp.second == result_id;
		            }) == end(header.declare_temporary))
		{
			header.declare_temporary.emplace_back(result_type, result_id);
			hoisted_temporaries.insert(result_id);
			force_recompile();
		}
	}
	else if (hoisted_temporaries.count(result_id) == 0)
	{
		auto &type = get<SPIRType>(result_type);
		auto &flags = get_decoration_bitset(result_id);

		// The result_id has not been made into an expression yet, so use flags interface.
		add_local_variable_name(result_id);

		string initializer;
		if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			initializer = join(" = ", to_zero_initialized_expression(result_type));

		statement(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(result_id)), initializer, ";");
	}
}